

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MessagesTestCase.cpp
# Opt level: O0

void __thiscall
SuiteMessageTests::TestsequenceResetSetString::~TestsequenceResetSetString
          (TestsequenceResetSetString *this)

{
  TestsequenceResetSetString *this_local;
  
  ~TestsequenceResetSetString(this);
  operator_delete(this,0x38);
  return;
}

Assistant:

TEST(sequenceResetSetString)
{
  SequenceReset object;

  object.setString
    ( "8=FIX.4.2\0019=17\00135=4\00136=88\001123=Y\00110=028\001" );

  GapFillFlag gapFillFlag;
  NewSeqNo newSeqNo;
  CHECK( object.get( gapFillFlag ) );
  CHECK_EQUAL( 88, object.get( newSeqNo ) );
}